

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar5 = run_container_cardinality(container1);
  iVar6 = container2->cardinality;
  if (iVar6 == -1) {
    iVar6 = bitset_container_compute_cardinality(container2);
  }
  uVar8 = 0;
  if (iVar6 == iVar5) {
    uVar3 = container1->n_runs;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = container1->runs[uVar8].value;
      uVar2 = container1->runs[uVar8].length;
      if (uVar2 == 0) {
        if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0010b550;
      }
      else {
        _Var4 = bitset_container_get_range(container2,(uint)uVar1,(uint)uVar1 + (uint)uVar2 + 1);
        if (!_Var4) {
LAB_0010b550:
          uVar8 = 0;
          goto LAB_0010b553;
        }
      }
    }
    uVar8 = (ulong)((long)(int)uVar3 <= (long)uVar8);
  }
LAB_0010b553:
  return SUB81(uVar8,0);
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {

    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) ?
                      container2->cardinality :
                      bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}